

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.cpp
# Opt level: O1

ssize_t __thiscall libnbt::NBTTagList::read(NBTTagList *this,int __fd,void *__buf,size_t __nbytes)

{
  pointer *pppNVar1;
  iterator __position;
  int iVar2;
  undefined4 extraout_var;
  NBTBase *extraout_RAX;
  undefined4 in_register_00000034;
  istream *in;
  int32_t size;
  NBTBase *tag;
  int local_34;
  NBTBase *local_30;
  NBTBase *pNVar3;
  
  in = (istream *)CONCAT44(in_register_00000034,__fd);
  std::istream::get((char *)in);
  local_34 = 0;
  readBytes(in,(char *)&local_34,'\x04');
  iVar2 = (*(this->super_NBTTagVector<libnbt::NBTBase_*>).super_NBTBase._vptr_NBTBase[8])(this);
  pNVar3 = (NBTBase *)CONCAT44(extraout_var,iVar2);
  if (0 < local_34) {
    iVar2 = 0;
    do {
      local_30 = createNewTag(this->child);
      (**local_30->_vptr_NBTBase)(local_30,in);
      __position._M_current =
           (this->super_NBTTagVector<libnbt::NBTBase_*>).array.
           super__Vector_base<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->super_NBTTagVector<libnbt::NBTBase_*>).array.
          super__Vector_base<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<libnbt::NBTBase*,std::allocator<libnbt::NBTBase*>>::
        _M_realloc_insert<libnbt::NBTBase*const&>
                  ((vector<libnbt::NBTBase*,std::allocator<libnbt::NBTBase*>> *)
                   &(this->super_NBTTagVector<libnbt::NBTBase_*>).array,__position,&local_30);
        pNVar3 = extraout_RAX;
      }
      else {
        *__position._M_current = local_30;
        pppNVar1 = &(this->super_NBTTagVector<libnbt::NBTBase_*>).array.
                    super__Vector_base<libnbt::NBTBase_*,_std::allocator<libnbt::NBTBase_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppNVar1 = *pppNVar1 + 1;
        pNVar3 = local_30;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < local_34);
  }
  return (ssize_t)pNVar3;
}

Assistant:

void NBTTagList::read(std::istream &in) {
        in.get(child);
        int32_t size = 0;
        readBytes(in, (char *) &size, 4);
        clear();
        for (int i = 0; i < size; i++) {
            auto *tag = createNewTag((TAG_TYPE) child);
            tag->read(in);
            array.push_back(tag);
        }
    }